

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTPNListBase::adjust_for_dyn(CTPNListBase *this,tcpn_dyncomp_info *info)

{
  CTPNListEle *pCVar1;
  
  for (pCVar1 = this->head_; pCVar1 != (CTPNListEle *)0x0;
      pCVar1 = (pCVar1->super_CTPNListEleBase).next_) {
    (*(pCVar1->super_CTPNListEleBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
      [0x11])(pCVar1,info);
  }
  this->field_0x48 = this->field_0x48 & 0xfe;
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNListBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    CTPNListEle *cur;

    /* run through my list and adjust each element */
    for (cur = head_ ; cur != 0 ; cur = cur->get_next())
    {
        /* adjust this element */
        cur->adjust_for_dyn(info);
    }

    /* 
     *   force the list to be non-constant - in debugger mode, we have to
     *   build the value we push as a dynamic object, never as an actual
     *   constant, to ensure that the generated code can be deleted
     *   immediately after being executed 
     */
    is_const_ = FALSE;

    /* return myself */
    return this;
}